

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 02_position_offline.cpp
# Opt level: O0

int main(void)

{
  double dVar1;
  Result RVar2;
  ostream *poVar3;
  reference pvVar4;
  undefined1 high_precision;
  Vector<double> *new_acceleration_00;
  undefined1 local_1ef0 [8];
  array<ruckig::Bound,_3UL> position_extrema;
  undefined1 local_1e70 [8];
  array<double,_3UL> new_acceleration;
  array<double,_3UL> new_velocity;
  array<double,_3UL> new_position;
  double new_time;
  undefined1 local_1e18 [4];
  Result result;
  Trajectory<3UL,_ruckig::StandardVector> trajectory;
  undefined1 local_1d48 [8];
  Ruckig<3UL,_ruckig::StandardVector,_false> otg;
  array<double,_3UL> local_418;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined1 local_2e0 [8];
  InputParameter<3UL,_ruckig::StandardVector> input;
  
  input.interrupt_calculation_duration.super__Optional_base<double,_true,_true>._M_payload.
  super__Optional_payload_base<double>._12_4_ = 0;
  ruckig::InputParameter<3UL,_ruckig::StandardVector>::InputParameter<3UL,_0>
            ((InputParameter<3UL,_ruckig::StandardVector> *)local_2e0);
  local_2e8 = 0x3fe0000000000000;
  local_2f8 = 0;
  uStack_2f0 = 0;
  input.current_position._M_elems[1] = 0.5;
  input.duration_discretization = Continuous;
  input._20_4_ = 0;
  input.current_position._M_elems[0] = 0.0;
  local_308 = 0xbfe0000000000000;
  local_318 = 0;
  uStack_310 = 0xc00199999999999a;
  input.current_velocity._M_elems[1] = -0.5;
  input.current_position._M_elems[2] = 0.0;
  input.current_velocity._M_elems[0] = -2.2;
  local_328 = 0xbfe0000000000000;
  local_338 = 0;
  uStack_330 = 0x4004000000000000;
  input.current_acceleration._M_elems[1] = -0.5;
  input.current_velocity._M_elems[2] = 0.0;
  input.current_acceleration._M_elems[0] = 2.5;
  local_348 = 0xc00c000000000000;
  local_358 = 0x4014000000000000;
  uStack_350 = 0xc000000000000000;
  input.target_position._M_elems[1] = -3.5;
  input.current_acceleration._M_elems[2] = 5.0;
  input.target_position._M_elems[0] = -2.0;
  local_368 = 0xc000000000000000;
  local_378 = 0;
  uStack_370 = 0xbfe0000000000000;
  input.target_velocity._M_elems[1] = -2.0;
  input.target_position._M_elems[2] = 0.0;
  input.target_velocity._M_elems[0] = -0.5;
  local_388 = 0x3fe0000000000000;
  local_398 = 0;
  uStack_390 = 0;
  input.target_acceleration._M_elems[1] = 0.5;
  input.target_velocity._M_elems[2] = 0.0;
  input.target_acceleration._M_elems[0] = 0.0;
  local_3a8 = 0x4008000000000000;
  local_3b8 = 0x4008000000000000;
  uStack_3b0 = 0x3ff0000000000000;
  input.max_velocity._M_elems[1] = 3.0;
  input.target_acceleration._M_elems[2] = 3.0;
  input.max_velocity._M_elems[0] = 1.0;
  local_3c8 = 0x3ff0000000000000;
  local_3d8 = 0x4008000000000000;
  uStack_3d0 = 0x4000000000000000;
  input.max_acceleration._M_elems[1] = 1.0;
  input.max_velocity._M_elems[2] = 3.0;
  input.max_acceleration._M_elems[0] = 2.0;
  local_3e8 = 0x4000000000000000;
  local_3f8 = 0x4010000000000000;
  uStack_3f0 = 0x4008000000000000;
  input.max_jerk._M_elems[1] = 2.0;
  input.max_acceleration._M_elems[2] = 4.0;
  input.max_jerk._M_elems[0] = 3.0;
  local_418._M_elems[2] = -3.0;
  local_418._M_elems[0] = -2.0;
  local_418._M_elems[1] = -0.5;
  std::optional<std::array<double,3ul>>::operator=
            ((optional<std::array<double,3ul>> *)(input.max_jerk._M_elems + 2),&local_418);
  otg.delta_time = -2.0;
  std::optional<std::array<double,3ul>>::operator=
            ((optional<std::array<double,3ul>> *)
             &input.min_velocity.super__Optional_base<std::array<double,_3UL>,_true,_true>.
              _M_payload.super__Optional_payload_base<std::array<double,_3UL>_>._M_engaged,
             (array<double,_3UL> *)&otg.delta_time);
  ruckig::Ruckig<3UL,_ruckig::StandardVector,_false>::Ruckig<3UL,_0>
            ((Ruckig<3UL,_ruckig::StandardVector,_false> *)local_1d48);
  ruckig::Trajectory<3UL,_ruckig::StandardVector>::Trajectory<3UL,_0>
            ((Trajectory<3UL,_ruckig::StandardVector> *)local_1e18);
  RVar2 = ruckig::Ruckig<3UL,_ruckig::StandardVector,_false>::calculate
                    ((Ruckig<3UL,_ruckig::StandardVector,_false> *)local_1d48,
                     (InputParameter<3UL,_ruckig::StandardVector> *)local_2e0,
                     (Trajectory<3UL,_ruckig::StandardVector> *)local_1e18);
  if (RVar2 == ErrorInvalidInput) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Invalid input!");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    input.interrupt_calculation_duration.super__Optional_base<double,_true,_true>._M_payload.
    super__Optional_payload_base<double>._12_4_ = 0xffffffff;
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"Trajectory duration: ");
    dVar1 = ruckig::Trajectory<3UL,_ruckig::StandardVector>::get_duration
                      ((Trajectory<3UL,_ruckig::StandardVector> *)local_1e18);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar1);
    poVar3 = std::operator<<(poVar3," [s].");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    new_acceleration_00 = (Vector<double> *)local_1e70;
    ruckig::Trajectory<3UL,_ruckig::StandardVector>::at_time
              ((Trajectory<3UL,_ruckig::StandardVector> *)local_1e18,1.0,
               (Vector<double> *)(new_velocity._M_elems + 2),
               (Vector<double> *)(new_acceleration._M_elems + 2),new_acceleration_00);
    high_precision = SUB81(new_acceleration_00,0);
    poVar3 = std::operator<<((ostream *)&std::cout,"Position at time ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,1.0);
    poVar3 = std::operator<<(poVar3," [s]: ");
    ruckig::join<std::array<double,3ul>>
              ((string *)&position_extrema._M_elems[2].t_max,(ruckig *)(new_velocity._M_elems + 2),
               (array<double,_3UL> *)0x0,(bool)high_precision);
    poVar3 = std::operator<<(poVar3,(string *)&position_extrema._M_elems[2].t_max);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&position_extrema._M_elems[2].t_max);
    ruckig::Trajectory<3UL,_ruckig::StandardVector>::get_position_extrema
              ((Vector<Bound> *)local_1ef0,(Trajectory<3UL,_ruckig::StandardVector> *)local_1e18);
    poVar3 = std::operator<<((ostream *)&std::cout,"Position extremas for DoF 4 are ");
    pvVar4 = std::array<ruckig::Bound,_3UL>::operator[]((array<ruckig::Bound,_3UL> *)local_1ef0,2);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pvVar4->min);
    poVar3 = std::operator<<(poVar3," (min) to ");
    pvVar4 = std::array<ruckig::Bound,_3UL>::operator[]((array<ruckig::Bound,_3UL> *)local_1ef0,2);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pvVar4->max);
    poVar3 = std::operator<<(poVar3," (max)");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  ruckig::Trajectory<3UL,_ruckig::StandardVector>::~Trajectory
            ((Trajectory<3UL,_ruckig::StandardVector> *)local_1e18);
  ruckig::Ruckig<3UL,_ruckig::StandardVector,_false>::~Ruckig
            ((Ruckig<3UL,_ruckig::StandardVector,_false> *)local_1d48);
  ruckig::InputParameter<3UL,_ruckig::StandardVector>::~InputParameter
            ((InputParameter<3UL,_ruckig::StandardVector> *)local_2e0);
  return input.interrupt_calculation_duration.super__Optional_base<double,_true,_true>._M_payload.
         super__Optional_payload_base<double>._12_4_;
}

Assistant:

int main() {
    // Create input parameters
    InputParameter<3> input;
    input.current_position = {0.0, 0.0, 0.5};
    input.current_velocity = {0.0, -2.2, -0.5};
    input.current_acceleration = {0.0, 2.5, -0.5};

    input.target_position = {5.0, -2.0, -3.5};
    input.target_velocity = {0.0, -0.5, -2.0};
    input.target_acceleration = {0.0, 0.0, 0.5};

    input.max_velocity = {3.0, 1.0, 3.0};
    input.max_acceleration = {3.0, 2.0, 1.0};
    input.max_jerk = {4.0, 3.0, 2.0};

    // Set different constraints for negative direction
    input.min_velocity = {-2.0, -0.5, -3.0};
    input.min_acceleration = {-2.0, -2.0, -2.0};

    // We don't need to pass the control rate (cycle time) when using only offline features
    Ruckig<3> otg;
    Trajectory<3> trajectory;

    // Calculate the trajectory in an offline manner (outside of the control loop)
    Result result = otg.calculate(input, trajectory);
    if (result == Result::ErrorInvalidInput) {
        std::cout << "Invalid input!" << std::endl;
        return -1;
    }

    // Get duration of the trajectory
    std::cout << "Trajectory duration: " << trajectory.get_duration() << " [s]." << std::endl;

    double new_time = 1.0;

    // Then, we can calculate the kinematic state at a given time
    std::array<double, 3> new_position, new_velocity, new_acceleration;
    trajectory.at_time(new_time, new_position, new_velocity, new_acceleration);

    std::cout << "Position at time " << new_time << " [s]: " << join(new_position) << std::endl;

    // Get some info about the position extrema of the trajectory
    std::array<Bound, 3> position_extrema = trajectory.get_position_extrema();
    std::cout << "Position extremas for DoF 4 are " << position_extrema[2].min << " (min) to " << position_extrema[2].max << " (max)" << std::endl;
}